

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_movem(double *a,double *b,int nitem)

{
  long i;
  int nitem_local;
  double *b_local;
  double *a_local;
  
  i = (long)nitem;
  b_local = b;
  a_local = a;
  if (b < a) {
    while (i != 0) {
      *b_local = *a_local;
      i = i + -1;
      b_local = b_local + 1;
      a_local = a_local + 1;
    }
  }
  else {
    b_local = b + i;
    a_local = a + i;
    while (i != 0) {
      b_local[-1] = a_local[-1];
      i = i + -1;
      b_local = b_local + -1;
      a_local = a_local + -1;
    }
  }
  return;
}

Assistant:

static void HTS_movem(double *a, double *b, const int nitem)
{
   long i = (long) nitem;

   if (a > b)
      while (i--)
         *b++ = *a++;
   else {
      a += i;
      b += i;
      while (i--)
         *--b = *--a;
   }
}